

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O0

bool __thiscall BmsParser::Parser::Parse(Parser *this,char *text)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  size_type sVar6;
  byte local_81;
  string local_60 [8];
  string buf;
  char *pn;
  char *p;
  char *pcStack_28;
  bool r;
  char *encodetext;
  char *text_local;
  Parser *this_local;
  
  Clear(this);
  BmsBms::Clear(this->bms_);
  WriteLogLine(this,"Bms parsing started");
  pcStack_28 = (char *)0x0;
  iVar2 = BmsUtil::IsUTF8(text);
  encodetext = text;
  if (iVar2 == 0) {
    pcStack_28 = (char *)operator_new__(0xa00000);
    bVar1 = BmsUtil::convert_to_utf8(text,pcStack_28,"Shift_JIS",0xa00000);
    encodetext = pcStack_28;
    if (!bVar1) {
      if (pcStack_28 != (char *)0x0) {
        operator_delete(pcStack_28);
      }
      pcStack_28 = (char *)0x0;
      encodetext = text;
    }
  }
  pn = encodetext;
  do {
    local_81 = 0;
    if (pn != (char *)0x0) {
      local_81 = this->panic_ ^ 0xff;
    }
    if ((local_81 & 1) == 0) break;
    pn = anon_unknown_2::Trim(pn);
    pcVar3 = strchr(pn,10);
    std::__cxx11::string::string(local_60);
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::assign((char *)local_60);
    }
    else {
      std::__cxx11::string::assign((char *)local_60,(ulong)pn);
    }
    while ((lVar4 = std::__cxx11::string::size(), lVar4 != 0 &&
           (((pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 == '\r' ||
             (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 == ' ')) ||
            (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 == '\t'))))) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_60);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = IsRandomStatement(this,pcVar5);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->syntax_line_data_,(value_type *)local_60);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->line_data_,(value_type *)local_60);
    }
    if (pcVar3 != (char *)0x0) {
      pn = pcVar3 + 1;
    }
    std::__cxx11::string::~string(local_60);
  } while (pcVar3 != (char *)0x0);
  if ((pcStack_28 != (char *)0x0) && (pcStack_28 != (char *)0x0)) {
    operator_delete__(pcStack_28);
  }
  sVar6 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->syntax_tag_);
  if (sVar6 != 0) {
    WriteLogLine(this,"parsing error - statement hadn\'t finished completely.");
    this->panic_ = true;
  }
  if ((this->panic_ & 1U) == 0) {
    this_local._7_1_ = ParseLines(this);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::Parse(const char* text) {
		// initalize first
		Clear();
		bms_.Clear();
		WriteLogLine("Bms parsing started");

		// detect encoding
		char* encodetext = 0;
		if (!BmsUtil::IsUTF8(text)) {
			encodetext = new char[1024 * 1024 * 10];
			bool r = BmsUtil::convert_to_utf8(text, encodetext,
				BmsBelOption::DEFAULT_FALLBACK_ENCODING, 1024 * 1024 * 10);
			if (!r) {
				delete encodetext;
				encodetext = 0;
			}
			else {
				text = encodetext;
			}
		}

		// split lines
		for (const char *p = text; p && !panic_;) {
			// trim first
			p = Trim(p);
			// cut command
			const char* pn = strchr(p, '\n');
			std::string buf;
			if (!pn)
				buf.assign(p);
			else
				buf.assign(p, pn - p);
			// trim end of the line
			while (buf.size() > 0) {
				if (buf.back() == '\r' || buf.back() == ' ' || buf.back() == '\t')
					//buf.pop_back(); - don't work in travis
					buf.resize(buf.size() - 1);
				else
					break;
			}
			/*
			 * it's more easy and better to distinguish random statement in here
			 */
			if (IsRandomStatement(buf.c_str()))
				syntax_line_data_.push_back(buf);
			else
				line_data_.push_back(buf);
			if (!pn) break;
			p = pn + 1;
		}
		if (encodetext)
			delete[] encodetext;

		// if there's panic in random statement,
		// stop parsing
		if (syntax_tag_.size() != 0) {
			WriteLogLine("parsing error - statement hadn't finished completely.");
			panic_ = true;
		}
		if (panic_) return false;

		// parse lines
		return ParseLines();
	}